

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O0

string * __thiscall
glcts::DrawBuffersIndexedBlending::GenFS_abi_cxx11_
          (string *__return_storage_ptr__,DrawBuffersIndexedBlending *this,int maxDrawBuffers)

{
  ostream *poVar1;
  int local_1b0;
  int local_1ac;
  int i_2;
  int i_1;
  int i;
  undefined1 local_198 [8];
  ostringstream os;
  int maxDrawBuffers_local;
  DrawBuffersIndexedBlending *this_local;
  
  os._372_4_ = maxDrawBuffers;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::operator<<((ostream *)local_198,
                  "#version 300 es                        \nprecision highp float;                 \nprecision highp int;                   \n"
                 );
  for (i_2 = 0; i_2 < (int)os._372_4_; i_2 = i_2 + 1) {
    poVar1 = std::operator<<((ostream *)local_198,"\nlayout(location = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_2);
    poVar1 = std::operator<<(poVar1,") out vec4 color");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,i_2);
    std::operator<<(poVar1,";");
  }
  for (local_1ac = 0; local_1ac < (int)os._372_4_; local_1ac = local_1ac + 1) {
    poVar1 = std::operator<<((ostream *)local_198,"\nuniform vec4 c");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1ac);
    std::operator<<(poVar1,";");
  }
  std::operator<<((ostream *)local_198,"\nvoid main() {");
  for (local_1b0 = 0; local_1b0 < (int)os._372_4_; local_1b0 = local_1b0 + 1) {
    poVar1 = std::operator<<((ostream *)local_198,"\n    color");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    poVar1 = std::operator<<(poVar1," = c");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1b0);
    std::operator<<(poVar1,";");
  }
  std::operator<<((ostream *)local_198,"\n}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawBuffersIndexedBlending::GenFS(int maxDrawBuffers)
{
	std::ostringstream os;
	os << "#version 300 es                        \n"
		  "precision highp float;                 \n"
		  "precision highp int;                   \n";

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\nlayout(location = " << i << ") out vec4 color" << i << ";";
	}
	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\nuniform vec4 c" << i << ";";
	}

	os << "\nvoid main() {";

	for (int i = 0; i < maxDrawBuffers; ++i)
	{
		os << "\n    color" << i << " = c" << i << ";";
	}

	os << "\n}";
	return os.str();
}